

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O0

bool __thiscall ON_SectionStyle::Write(ON_SectionStyle *this,ON_BinaryArchive *file)

{
  ON_BinaryArchive *pOVar1;
  bool bVar2;
  SectionBackgroundFillMode SVar3;
  SectionBackgroundFillMode SVar4;
  SectionFillRule SVar5;
  int iVar6;
  uint uVar7;
  ON_Linetype *pOVar8;
  double dVar9;
  bool local_f1;
  bool local_b1;
  bool local_92;
  uchar attributes_end;
  uchar itemType_10;
  ON_Linetype *customLinetype;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_70;
  undefined1 local_69;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_68;
  anon_union_4_2_6147a14e_for_ON_Color_15 aStack_64;
  uchar itemType_9;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  anon_union_4_2_6147a14e_for_ON_Color_15 aStack_58;
  uchar itemType_8;
  uchar itemType_7;
  uchar itemType_6;
  uchar itemType_5;
  uchar itemType_4;
  undefined1 local_4d;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_4c;
  anon_union_4_2_6147a14e_for_ON_Color_15 aStack_48;
  uchar itemType_3;
  undefined1 local_41;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_40;
  anon_union_4_2_6147a14e_for_ON_Color_15 aStack_3c;
  uchar itemType_2;
  undefined1 local_35;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_34;
  anon_union_4_2_6147a14e_for_ON_Color_15 aStack_30;
  uchar itemType_1;
  SectionBackgroundFillMode local_2a;
  undefined1 local_29;
  undefined4 local_28;
  uchar mode;
  uchar itemType;
  int minor_version;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_SectionStyle *this_local;
  
  itemType = '\0';
  local_28 = 1;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,1);
  if (!bVar2) {
    return false;
  }
  bVar2 = ON_BinaryArchive::WriteModelComponentAttributes
                    (_minor_version,&this->super_ON_ModelComponent,0x78);
  if (!bVar2) goto LAB_00838f2f;
  SVar3 = BackgroundFillMode(this);
  SVar4 = BackgroundFillMode(&Unset);
  if (SVar3 != SVar4) {
    local_29 = 1;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\x01');
    if (!bVar2) goto LAB_00838f2f;
    local_2a = BackgroundFillMode(this);
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,local_2a);
    if (!bVar2) goto LAB_00838f2f;
  }
  aStack_30 = (anon_union_4_2_6147a14e_for_ON_Color_15)BackgroundFillColor(this,false);
  bVar2 = ON_Color::IsSet((ON_Color *)&stack0xffffffffffffffd0);
  local_92 = true;
  if (!bVar2) {
    local_34 = (anon_union_4_2_6147a14e_for_ON_Color_15)BackgroundFillColor(this,true);
    local_92 = ON_Color::IsSet((ON_Color *)&local_34);
  }
  if (local_92 != false) {
    local_35 = 2;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\x02');
    pOVar1 = _minor_version;
    if (!bVar2) goto LAB_00838f2f;
    aStack_3c = (anon_union_4_2_6147a14e_for_ON_Color_15)BackgroundFillColor(this,false);
    bVar2 = ON_BinaryArchive::WriteColor(pOVar1,(ON_Color *)&stack0xffffffffffffffc4);
    pOVar1 = _minor_version;
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00838f2f;
    local_40 = (anon_union_4_2_6147a14e_for_ON_Color_15)BackgroundFillColor(this,true);
    bVar2 = ON_BinaryArchive::WriteColor(pOVar1,(ON_Color *)&local_40);
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00838f2f;
  }
  bVar2 = BoundaryVisible(this);
  if (!bVar2) {
    local_41 = 3;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\x03');
    pOVar1 = _minor_version;
    if (!bVar2) goto LAB_00838f2f;
    bVar2 = BoundaryVisible(this);
    bVar2 = ON_BinaryArchive::WriteBool(pOVar1,bVar2);
    if (!bVar2) goto LAB_00838f2f;
  }
  aStack_48 = (anon_union_4_2_6147a14e_for_ON_Color_15)BoundaryColor(this,false);
  bVar2 = ON_Color::IsSet((ON_Color *)&stack0xffffffffffffffb8);
  local_b1 = true;
  if (!bVar2) {
    local_4c = (anon_union_4_2_6147a14e_for_ON_Color_15)BoundaryColor(this,true);
    local_b1 = ON_Color::IsSet((ON_Color *)&local_4c);
  }
  if (local_b1 != false) {
    local_4d = 4;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\x04');
    pOVar1 = _minor_version;
    if (!bVar2) goto LAB_00838f2f;
    _itemType_7 = (anon_union_4_2_6147a14e_for_ON_Color_15)BoundaryColor(this,false);
    bVar2 = ON_BinaryArchive::WriteColor(pOVar1,(ON_Color *)&itemType_7);
    pOVar1 = _minor_version;
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00838f2f;
    aStack_58 = (anon_union_4_2_6147a14e_for_ON_Color_15)BoundaryColor(this,true);
    bVar2 = ON_BinaryArchive::WriteColor(pOVar1,(ON_Color *)&stack0xffffffffffffffa8);
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00838f2f;
  }
  dVar9 = BoundaryWidthScale(this);
  if (2.220446049250313e-16 < ABS(dVar9 - DefaultSectionStylePrivate.m_boundary_width_scale)) {
    local_59 = 5;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\x05');
    pOVar1 = _minor_version;
    if (!bVar2) goto LAB_00838f2f;
    dVar9 = BoundaryWidthScale(this);
    bVar2 = ON_BinaryArchive::WriteDouble(pOVar1,dVar9);
    if (!bVar2) goto LAB_00838f2f;
  }
  SVar5 = SectionFillRule(this);
  if (SVar5 != DefaultSectionStylePrivate.m_fill_rule) {
    local_5a = 6;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\x06');
    pOVar1 = _minor_version;
    if (!bVar2) goto LAB_00838f2f;
    SVar5 = SectionFillRule(this);
    bVar2 = ON_BinaryArchive::WriteChar(pOVar1,SVar5);
    if (!bVar2) goto LAB_00838f2f;
  }
  iVar6 = HatchIndex(this);
  if (iVar6 != DefaultSectionStylePrivate.m_hatch_index) {
    local_5b = 7;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\a');
    pOVar1 = _minor_version;
    if (!bVar2) goto LAB_00838f2f;
    iVar6 = HatchIndex(this);
    bVar2 = ON_BinaryArchive::WriteInt(pOVar1,iVar6);
    if (!bVar2) goto LAB_00838f2f;
  }
  dVar9 = HatchScale(this);
  if (2.220446049250313e-16 < ABS(dVar9 - 1.0)) {
    local_5c = 8;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\b');
    pOVar1 = _minor_version;
    if (!bVar2) goto LAB_00838f2f;
    dVar9 = HatchScale(this);
    bVar2 = ON_BinaryArchive::WriteDouble(pOVar1,dVar9);
    if (!bVar2) goto LAB_00838f2f;
  }
  dVar9 = HatchRotation(this);
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_5d = 9;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\t');
    pOVar1 = _minor_version;
    if (!bVar2) goto LAB_00838f2f;
    dVar9 = HatchRotation(this);
    bVar2 = ON_BinaryArchive::WriteDouble(pOVar1,dVar9);
    if (!bVar2) goto LAB_00838f2f;
  }
  aStack_64 = (anon_union_4_2_6147a14e_for_ON_Color_15)HatchColor(this,false);
  bVar2 = ON_Color::IsSet((ON_Color *)&stack0xffffffffffffff9c);
  local_f1 = true;
  if (!bVar2) {
    local_68 = (anon_union_4_2_6147a14e_for_ON_Color_15)HatchColor(this,true);
    local_f1 = ON_Color::IsSet((ON_Color *)&local_68);
  }
  if (local_f1 != false) {
    local_69 = 10;
    bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\n');
    pOVar1 = _minor_version;
    if (!bVar2) goto LAB_00838f2f;
    local_70 = (anon_union_4_2_6147a14e_for_ON_Color_15)HatchColor(this,false);
    bVar2 = ON_BinaryArchive::WriteColor(pOVar1,(ON_Color *)&local_70);
    pOVar1 = _minor_version;
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00838f2f;
    customLinetype._4_4_ = (anon_union_4_2_6147a14e_for_ON_Color_15)HatchColor(this,true);
    bVar2 = ON_BinaryArchive::WriteColor(pOVar1,(ON_Color *)((long)&customLinetype + 4));
    if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_00838f2f;
  }
  pOVar8 = BoundaryLinetype(this);
  if (((pOVar8 == (ON_Linetype *)0x0) ||
      ((bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\v'), bVar2 &&
       (uVar7 = (*(pOVar8->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[10])(),
       (uVar7 & 1) != 0)))) && (bVar2 = ON_BinaryArchive::WriteChar(_minor_version,'\0'), bVar2)) {
    itemType = '\x01';
  }
LAB_00838f2f:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(_minor_version);
  if (!bVar2) {
    itemType = '\0';
  }
  return (bool)(itemType & 1);
}

Assistant:

bool ON_SectionStyle::Write( ON_BinaryArchive& file) const
{
  bool rc = false;
  {
    const int minor_version = 1;
    if (!file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK, 1, minor_version))
      return false;
    for (;;)
    {
      // chunk version 1.0 fields
      if (!file.WriteModelComponentAttributes(*this,ON_ModelComponent::Attributes::BinaryArchiveAttributes))
        break;

      // Only write non-default values in a similar fashion as ON_3dmObjectAttributes
      if (BackgroundFillMode() != ON_SectionStyle::Unset.BackgroundFillMode())
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BackgroundFillMode; // 1
        if (!file.WriteChar(itemType))
          break;
        unsigned char mode = (unsigned char)BackgroundFillMode();
        if (!file.WriteChar(mode))
          break;
      }
      if (BackgroundFillColor(false).IsSet() || BackgroundFillColor(true).IsSet())
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BackgroundFillColor; // 2
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteColor(BackgroundFillColor(false)))
          break;
        if (!file.WriteColor(BackgroundFillColor(true)))
          break;
      }
      if (BoundaryVisible() != true)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BoundaryVisible; // 3
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteBool(BoundaryVisible()))
          break;
      }
      if (BoundaryColor(false).IsSet() || BoundaryColor(true).IsSet())
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BoundaryColor; // 4
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteColor(BoundaryColor(false)))
          break;
        if (!file.WriteColor(BoundaryColor(true)))
          break;
      }
      if (fabs(BoundaryWidthScale() - DefaultSectionStylePrivate.m_boundary_width_scale) > ON_EPSILON)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BoundaryWidthScale; // 5
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteDouble(BoundaryWidthScale()))
          break;
      }
      if (SectionFillRule() != DefaultSectionStylePrivate.m_fill_rule)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::SectionFillRule; // 6
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteChar((unsigned char)SectionFillRule()))
          break;
      }
      if (HatchIndex() != DefaultSectionStylePrivate.m_hatch_index)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::HatchIndex; // 7
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteInt(HatchIndex()))
          break;
      }
      if (fabs(HatchScale() - 1.0) > ON_EPSILON)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::HatchScale; // 8
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteDouble(HatchScale()))
          break;
      }
      if (HatchRotation() != 0.0)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::HatchRotation; // 9
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteDouble(HatchRotation()))
          break;
      }
      if (HatchColor(false).IsSet() || HatchColor(true).IsSet())
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::HatchColor; // 10
        if (!file.WriteChar(itemType))
          break;
        if (!file.WriteColor(HatchColor(false)))
          break;
        if (!file.WriteColor(HatchColor(true)))
          break;
      }

      // chunk version 1.1 fields
      const ON_Linetype* customLinetype = BoundaryLinetype();
      if (customLinetype != nullptr)
      {
        const unsigned char itemType = ON_SectionStyleTypeCodes::BoundaryLinetype; // 11
        if (!file.WriteChar(itemType))
          break;
        if (!customLinetype->Write(file))
          break;
      }

      // 0 indicates end of new linetype attributes
      const unsigned char attributes_end = 0;
      if (!file.WriteChar(attributes_end))
        break;

      rc = true;
      break;
    }
  }
  if (!file.EndWrite3dmChunk())
    rc = false;
  return rc;
}